

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O3

QVariant * __thiscall
QSystemLocale::query
          (QVariant *__return_storage_ptr__,QSystemLocale *this,QueryType type,QVariant *in)

{
  double value;
  long lVar1;
  QString *pQVar2;
  bool bVar3;
  QTime QVar4;
  MeasurementSystem val;
  CurrencySymbolFormat format;
  DayOfWeek val_00;
  uint uVar5;
  int iVar6;
  QDate QVar7;
  qlonglong value_00;
  qulonglong value_01;
  undefined8 data;
  long lVar8;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QLatin1StringView other_00;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QStringView QVar9;
  GroupSizes GVar10;
  QStringBuilder<char16_t,_QStringView_&> local_e8;
  QStringView local_d8;
  QStringView local_c8;
  QArrayDataPointer<QString> local_b8;
  QArrayDataPointer<QString> local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QReadWriteLock *local_60;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
LAB_003ecd07:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_003ecd1d;
  }
  if ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
       instance()::holder == '\0') &&
     (iVar6 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                                   ::instance()::holder), iVar6 != 0)) {
    QSystemLocaleData::QSystemLocaleData
              ((QSystemLocaleData *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
               ::instance()::holder);
    QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>::guard._q_value.
    super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
    __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>::~Holder,
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                 ::instance()::holder,&__dso_handle);
    __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder);
  }
  if (type == LocaleChanged) {
    QSystemLocaleData::readEnvironment
              ((QSystemLocaleData *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
               ::instance()::holder);
    goto LAB_003ecd07;
  }
  QReadWriteLock::lockForRead
            ((QReadWriteLock *)
             QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
             instance()::holder);
  local_60 = (QReadWriteLock *)
             (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
              ::instance()::holder + 1);
  if (0x2d < type - DecimalPoint) {
switchD_003ecd79_caseD_1e:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_003ed49d;
  }
  ba.m_data = (storage_type *)
              ((long)&switchD_003ecd79::switchdataD_00584014 +
              (long)(int)(&switchD_003ecd79::switchdataD_00584014)[type - DecimalPoint]);
  switch(type) {
  case DecimalPoint:
    QLocale::decimalPoint
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case Grouping:
    GVar10 = QLocaleData::groupSizes
                       (*(QLocaleData **)
                         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder._8_8_);
    local_58.d = GVar10._0_8_;
    local_58.ptr._0_4_ = GVar10.least;
    ::QVariant::fromValue<QLocaleData::GroupSizes,_true>
              (__return_storage_ptr__,(GroupSizes *)&local_58);
    goto LAB_003ed49d;
  case GroupSeparator:
    QLocale::groupSeparator
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case ZeroDigit:
    QLocale::zeroDigit((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 8));
    break;
  case NegativeSign:
    QLocale::negativeSign
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case DateFormatLong:
    QLocale::dateFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),LongFormat);
    break;
  case DateFormatShort:
    QLocale::dateFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),ShortFormat);
    break;
  case TimeFormatLong:
    QLocale::timeFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),LongFormat);
    break;
  case TimeFormatShort:
    QLocale::timeFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),ShortFormat);
    break;
  case DayNameLong:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::dayName((QString *)&local_58,
                     (QLocale *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x10),iVar6,LongFormat);
    break;
  case DayNameShort:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::dayName((QString *)&local_58,
                     (QLocale *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x10),iVar6,ShortFormat);
    break;
  case DayNameNarrow:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::dayName((QString *)&local_58,
                     (QLocale *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x10),iVar6,NarrowFormat);
    break;
  case MonthNameLong:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::monthName((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x10),iVar6,LongFormat);
    break;
  case MonthNameShort:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::monthName((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x10),iVar6,ShortFormat);
    break;
  case MonthNameNarrow:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::monthName((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x10),iVar6,NarrowFormat);
    break;
  case DateToStringLong:
    QVar7 = ::QVariant::toDate(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar7,LongFormat);
    break;
  case DateToStringShort:
    QVar7 = ::QVariant::toDate(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar7,ShortFormat);
    break;
  case TimeToStringLong:
    QVar4 = ::QVariant::toTime(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar4,LongFormat);
    break;
  case TimeToStringShort:
    QVar4 = ::QVariant::toTime(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar4,ShortFormat);
    break;
  case DateTimeFormatLong:
    QLocale::dateTimeFormat
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),LongFormat);
    break;
  case DateTimeFormatShort:
    QLocale::dateTimeFormat
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),ShortFormat);
    break;
  case DateTimeToStringLong:
    ::QVariant::toDateTime((QVariant *)&local_78);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),(QDateTime *)&local_78.shared,LongFormat);
    goto LAB_003ed183;
  case DateTimeToStringShort:
    ::QVariant::toDateTime((QVariant *)&local_78);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),(QDateTime *)&local_78.shared,ShortFormat);
LAB_003ed183:
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    QDateTime::~QDateTime((QDateTime *)&local_78.shared);
    goto LAB_003ed49d;
  case MeasurementSystem:
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr._0_4_ = -0x55555556;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    ba.m_size = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder._72_8_;
    QString::fromLatin1((QString *)&local_58,
                        (QString *)
                        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder._80_8_,ba);
    other.m_data = "Metric";
    other.m_size = 6;
    iVar6 = QString::compare((QString *)&local_58,other,CaseInsensitive);
    if ((iVar6 == 0) ||
       (other_00.m_data = "Other", other_00.m_size = 5,
       iVar6 = QString::compare((QString *)&local_58,other_00,CaseInsensitive), iVar6 == 0)) {
      ::QVariant::QVariant(__return_storage_ptr__,0);
    }
    else {
      QLocale::QLocale((QLocale *)&local_78.shared,(QString *)&local_58);
      val = QLocale::measurementSystem((QLocale *)&local_78.shared);
      ::QVariant::QVariant(__return_storage_ptr__,val);
      QLocale::~QLocale((QLocale *)&local_78.shared);
    }
    goto LAB_003ed47c;
  case PositiveSign:
    QLocale::positiveSign
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case AMText:
    QLocale::amText((QString *)&local_58,
                    (QLocale *)
                    (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                     ::instance()::holder + 0x10));
    break;
  case PMText:
    QLocale::pmText((QString *)&local_58,
                    (QLocale *)
                    (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                     ::instance()::holder + 0x10));
    break;
  case FirstDayOfWeek:
    val_00 = QLocale::firstDayOfWeek
                       ((QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10));
    ::QVariant::QVariant(__return_storage_ptr__,val_00);
    goto LAB_003ed49d;
  default:
    goto switchD_003ecd79_caseD_1e;
  case CurrencySymbol:
    format = ::QVariant::toUInt(in,(bool *)0x0);
    QLocale::currencySymbol
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x18),format);
    break;
  case CurrencyToString:
    iVar6 = ::QVariant::typeId(in);
    switch(iVar6) {
    case 2:
      iVar6 = ::QVariant::toInt(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = (undefined1 *)0x0;
      local_78._16_8_ = (undefined1 *)0x0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),(long)iVar6,(QString *)&local_78);
      break;
    case 3:
      uVar5 = ::QVariant::toUInt(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = (undefined1 *)0x0;
      local_78._16_8_ = (undefined1 *)0x0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),(ulong)uVar5,(QString *)&local_78);
      break;
    case 4:
      value_00 = ::QVariant::toLongLong(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = (undefined1 *)0x0;
      local_78._16_8_ = (undefined1 *)0x0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),value_00,(QString *)&local_78);
      break;
    case 5:
      value_01 = ::QVariant::toULongLong(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = (undefined1 *)0x0;
      local_78._16_8_ = (undefined1 *)0x0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),value_01,(QString *)&local_78);
      break;
    case 6:
      value = ::QVariant::toDouble(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = (undefined1 *)0x0;
      local_78._16_8_ = (undefined1 *)0x0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),value,(QString *)&local_78,-1);
      break;
    default:
      local_58.d = (Data *)0x0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size = 0;
      goto LAB_003ed46e;
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
LAB_003ed941:
    if ((QArrayData *)local_78.shared == (QArrayData *)0x0) goto LAB_003ed49d;
    LOCK();
    (((QBasicAtomicInt *)&(local_78.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_78.shared)->ref)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    data = local_78.shared;
    if ((((QBasicAtomicInt *)&(local_78.shared)->ref)->_q_value).super___atomic_base<int>._M_i != 0)
    goto LAB_003ed49d;
    goto LAB_003ed48e;
  case Collation:
    ba_00.m_data = ba.m_data;
    ba_00.m_size = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                   ::instance()::holder._96_8_;
    QString::fromLatin1((QString *)&local_58,
                        (QString *)
                        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder._104_8_,ba_00);
    break;
  case UILanguages:
    if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
        instance()::holder._128_8_ == 0) {
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      qgetenv((QByteArray *)&local_58,"LANGUAGE");
      ba_01.m_size._4_4_ = local_58.ptr._4_4_;
      ba_01.m_size._0_4_ = (int)local_58.ptr;
      ba_01.m_data = ba.m_data;
      QString::fromLatin1((QString *)&local_78,(QString *)local_58.size,ba_01);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
        }
      }
      local_98.d = (Data *)0x0;
      local_98.ptr = (QString *)0x0;
      local_98.size = 0;
      if ((undefined1 *)local_78._16_8_ == (undefined1 *)0x0) {
        ba_02.m_data = ba.m_data;
        ba_02.m_size = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder._48_8_;
        QString::fromLatin1((QString *)&local_58,
                            (QString *)
                            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                            ::instance()::holder._56_8_,ba_02);
        QList<QString>::append((QList<QString> *)&local_98,(rvalue_ref)&local_58);
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        QString::split((QStringList *)&local_b8,(QString *)&local_78,(QChar)0x3a,(SplitBehavior)0x0,
                       CaseSensitive);
        local_58.size = local_98.size;
        pQVar2 = local_98.ptr;
        local_58.d = local_98.d;
        local_98.size = local_b8.size;
        local_98.ptr = local_b8.ptr;
        local_98.d = local_b8.d;
        local_b8.size = 0;
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (QString *)0x0;
        local_58.ptr._0_4_ = (int)pQVar2;
        local_58.ptr._4_4_ = (undefined4)((ulong)pQVar2 >> 0x20);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
      }
      pQVar2 = local_98.ptr;
      if ((QString *)local_98.size != (QString *)0x0) {
        lVar1 = local_98.size * 0x18;
        lVar8 = 0;
        do {
          local_b8.d = (Data *)0x0;
          local_b8.ptr = (QString *)0x0;
          local_c8.m_size = 0;
          local_c8.m_data = (storage_type_conflict *)0x0;
          local_d8.m_size = 0;
          local_d8.m_data = (storage_type_conflict *)0x0;
          QVar9.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).ptr + lVar8);
          QVar9.m_size = *(qsizetype *)((long)&(pQVar2->d).size + lVar8);
          bVar3 = qt_splitLocaleName(QVar9,(QStringView *)&local_b8,&local_c8,&local_d8);
          if (bVar3) {
            local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.ptr._0_4_ = -0x55555556;
            local_58.ptr._4_4_ = 0xaaaaaaaa;
            if (&(local_b8.d)->super_QArrayData == (QArrayData *)0x0) {
              local_58.d = (Data *)0x0;
              local_58.ptr._0_4_ = 0x4d5a80;
              local_58.ptr._4_4_ = 0;
              local_58.size = 3;
            }
            else {
              QString::QString((QString *)&local_58,(QChar *)local_b8.ptr,(qsizetype)local_b8.d);
            }
            if (local_c8.m_size != 0) {
              local_e8.a = L'-';
              local_e8.b = &local_c8;
              ::operator+=((QString *)&local_58,&local_e8);
            }
            if (local_d8.m_size != 0) {
              local_e8.a = L'-';
              local_e8.b = &local_d8;
              ::operator+=((QString *)&local_58,&local_e8);
            }
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x70),
                       QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder._128_8_,(QString *)&local_58);
            QList<QString>::end((QList<QString> *)
                                (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                                 ::instance()::holder + 0x70));
            if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
              }
            }
          }
          lVar8 = lVar8 + 0x18;
        } while (lVar1 != lVar8);
      }
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
          instance()::holder._128_8_ == 0) {
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      }
      else {
        ::QVariant::QVariant
                  (__return_storage_ptr__,
                   (QStringList *)
                   (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                    ::instance()::holder + 0x70));
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      goto LAB_003ed941;
    }
    ::QVariant::QVariant
              (__return_storage_ptr__,
               (QStringList *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x70));
    goto LAB_003ed49d;
  case StringToStandardQuotation:
    QVar9 = qvariant_cast<QStringView>(in);
    QLocale::quoteString
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x20),QVar9,StandardQuotation);
    break;
  case StringToAlternateQuotation:
    QVar9 = qvariant_cast<QStringView>(in);
    QLocale::quoteString
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x20),QVar9,AlternateQuotation);
    break;
  case ListToSeparatedString:
    ::QVariant::toStringList((QStringList *)&local_78,in);
    QLocale::createSeparatedList
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x20),(QStringList *)&local_78);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    goto LAB_003ed49d;
  case StandaloneMonthNameLong:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneMonthName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar6,LongFormat);
    break;
  case StandaloneMonthNameShort:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneMonthName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar6,ShortFormat);
    break;
  case StandaloneMonthNameNarrow:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneMonthName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar6,NarrowFormat);
    break;
  case StandaloneDayNameLong:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneDayName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar6,LongFormat);
    break;
  case StandaloneDayNameShort:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneDayName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar6,ShortFormat);
    break;
  case StandaloneDayNameNarrow:
    iVar6 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneDayName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar6,NarrowFormat);
  }
LAB_003ed46e:
  ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
LAB_003ed47c:
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    data = local_58.d;
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_003ed48e:
      QArrayData::deallocate((QArrayData *)data,2,0x10);
    }
  }
LAB_003ed49d:
  if (((ulong)local_60 & 1) != 0) {
    local_60 = (QReadWriteLock *)((ulong)local_60 & 0xfffffffffffffffe);
    QReadWriteLock::unlock(local_60);
  }
LAB_003ecd1d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QSystemLocale::query(QueryType type, QVariant &&in) const
{
    QSystemLocaleData *d = qSystemLocaleData();
    if (!d)
        return QVariant();

    if (type == LocaleChanged) {
        d->readEnvironment();
        return QVariant();
    }

    QReadLocker locker(&d->lock);

    const QLocale &lc_numeric = d->lc_numeric;
    const QLocale &lc_time = d->lc_time;
    const QLocale &lc_monetary = d->lc_monetary;
    const QLocale &lc_messages = d->lc_messages;

    switch (type) {
    case DecimalPoint:
        return lc_numeric.decimalPoint();
    case Grouping:
        return QVariant::fromValue(lc_numeric.d->m_data->groupSizes());
    case GroupSeparator:
        return lc_numeric.groupSeparator();
    case ZeroDigit:
        return lc_numeric.zeroDigit();
    case NegativeSign:
        return lc_numeric.negativeSign();
    case DateFormatLong:
        return lc_time.dateFormat(QLocale::LongFormat);
    case DateFormatShort:
        return lc_time.dateFormat(QLocale::ShortFormat);
    case TimeFormatLong:
        return lc_time.timeFormat(QLocale::LongFormat);
    case TimeFormatShort:
        return lc_time.timeFormat(QLocale::ShortFormat);
    case DayNameLong:
        return lc_time.dayName(in.toInt(), QLocale::LongFormat);
    case DayNameShort:
        return lc_time.dayName(in.toInt(), QLocale::ShortFormat);
    case DayNameNarrow:
        return lc_time.dayName(in.toInt(), QLocale::NarrowFormat);
    case StandaloneDayNameLong:
        return lc_time.standaloneDayName(in.toInt(), QLocale::LongFormat);
    case StandaloneDayNameShort:
        return lc_time.standaloneDayName(in.toInt(), QLocale::ShortFormat);
    case StandaloneDayNameNarrow:
        return lc_time.standaloneDayName(in.toInt(), QLocale::NarrowFormat);
    case MonthNameLong:
        return lc_time.monthName(in.toInt(), QLocale::LongFormat);
    case MonthNameShort:
        return lc_time.monthName(in.toInt(), QLocale::ShortFormat);
    case MonthNameNarrow:
        return lc_time.monthName(in.toInt(), QLocale::NarrowFormat);
    case StandaloneMonthNameLong:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::LongFormat);
    case StandaloneMonthNameShort:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::ShortFormat);
    case StandaloneMonthNameNarrow:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::NarrowFormat);
    case DateToStringLong:
        return lc_time.toString(in.toDate(), QLocale::LongFormat);
    case DateToStringShort:
        return lc_time.toString(in.toDate(), QLocale::ShortFormat);
    case TimeToStringLong:
        return lc_time.toString(in.toTime(), QLocale::LongFormat);
    case TimeToStringShort:
        return lc_time.toString(in.toTime(), QLocale::ShortFormat);
    case DateTimeFormatLong:
        return lc_time.dateTimeFormat(QLocale::LongFormat);
    case DateTimeFormatShort:
        return lc_time.dateTimeFormat(QLocale::ShortFormat);
    case DateTimeToStringLong:
        return lc_time.toString(in.toDateTime(), QLocale::LongFormat);
    case DateTimeToStringShort:
        return lc_time.toString(in.toDateTime(), QLocale::ShortFormat);
    case PositiveSign:
        return lc_numeric.positiveSign();
    case AMText:
        return lc_time.amText();
    case PMText:
        return lc_time.pmText();
    case FirstDayOfWeek:
        return lc_time.firstDayOfWeek();
    case CurrencySymbol:
        return lc_monetary.currencySymbol(QLocale::CurrencySymbolFormat(in.toUInt()));
    case CurrencyToString: {
        switch (in.userType()) {
        case QMetaType::Int:
            return lc_monetary.toCurrencyString(in.toInt());
        case QMetaType::UInt:
            return lc_monetary.toCurrencyString(in.toUInt());
        case QMetaType::Double:
            return lc_monetary.toCurrencyString(in.toDouble());
        case QMetaType::LongLong:
            return lc_monetary.toCurrencyString(in.toLongLong());
        case QMetaType::ULongLong:
            return lc_monetary.toCurrencyString(in.toULongLong());
        default:
            break;
        }
        return QString();
    }
    case MeasurementSystem: {
        const QString meas_locale = QString::fromLatin1(d->lc_measurement_var);
        if (meas_locale.compare("Metric"_L1, Qt::CaseInsensitive) == 0)
            return QLocale::MetricSystem;
        if (meas_locale.compare("Other"_L1, Qt::CaseInsensitive) == 0)
            return QLocale::MetricSystem;
        return QVariant((int)QLocale(meas_locale).measurementSystem());
    }
    case Collation:
        return QString::fromLatin1(d->lc_collate_var);
    case UILanguages: {
        if (!d->uiLanguages.isEmpty())
            return d->uiLanguages;
        QString languages = QString::fromLatin1(qgetenv("LANGUAGE"));
        QStringList lst;
        if (languages.isEmpty())
            lst.append(QString::fromLatin1(d->lc_messages_var));
        else
            lst = languages.split(u':');

        for (const QString &e : std::as_const(lst)) {
            QStringView language, script, territory;
            if (qt_splitLocaleName(e, &language, &script, &territory)) {
                QString joined = language.isEmpty() ? u"und"_s : language.toString();
                if (!script.isEmpty())
                    joined += u'-' + script;
                if (!territory.isEmpty())
                    joined += u'-' + territory;
                d->uiLanguages.append(joined);
            }
        }
        return d->uiLanguages.isEmpty() ? QVariant() : QVariant(d->uiLanguages);
    }
    case StringToStandardQuotation:
        return lc_messages.quoteString(qvariant_cast<QStringView>(std::move(in)));
    case StringToAlternateQuotation:
        return lc_messages.quoteString(qvariant_cast<QStringView>(std::move(in)),
                                       QLocale::AlternateQuotation);
    case ListToSeparatedString:
        return lc_messages.createSeparatedList(in.toStringList());
    case LocaleChanged:
        Q_ASSERT(false);
        [[fallthrough]];
    default:
        break;
    }
    return QVariant();
}